

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void __thiscall google::protobuf::strings::AlphaNum::AlphaNum(AlphaNum *this,Hex hex)

{
  char *pcVar1;
  uint64 mask;
  uint64 width;
  uint64 value;
  char *writer;
  char *end;
  AlphaNum *this_local;
  Hex hex_local;
  
  value = hex.value;
  mask = 1L << (((char)hex.spec + -1) * '\x04' & 0x3fU) | value;
  writer = (char *)(this + 1);
  do {
    pcVar1 = writer + -1;
    writer[-1] = "0123456789abcdef"[value & 0xf];
    value = value >> 4;
    mask = mask >> 4;
    writer = pcVar1;
  } while (mask != 0);
  this->piece_data_ = pcVar1;
  this->piece_size_ = (long)(this + 1) - (long)pcVar1;
  return;
}

Assistant:

AlphaNum::AlphaNum(strings::Hex hex) {
  char *const end = &digits[kFastToBufferSize];
  char *writer = end;
  uint64 value = hex.value;
  uint64 width = hex.spec;
  // We accomplish minimum width by OR'ing in 0x10000 to the user's value,
  // where 0x10000 is the smallest hex number that is as wide as the user
  // asked for.
  uint64 mask = ((static_cast<uint64>(1) << (width - 1) * 4)) | value;
  static const char hexdigits[] = "0123456789abcdef";
  do {
    *--writer = hexdigits[value & 0xF];
    value >>= 4;
    mask >>= 4;
  } while (mask != 0);
  piece_data_ = writer;
  piece_size_ = end - writer;
}